

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O3

int __thiscall
soplex::SPxDevexPR<double>::selectLeaveX(SPxDevexPR<double> *this,double feastol,int start,int incr)

{
  double dVar1;
  double dVar2;
  SPxSolverBase<double> *pSVar3;
  pointer pdVar4;
  pointer pdVar5;
  int iVar6;
  ulong uVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  ulong uVar7;
  
  pSVar3 = (this->super_SPxPricer<double>).thesolver;
  pdVar4 = (pSVar3->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0xffffffff;
  iVar6 = -1;
  iVar9 = (int)((ulong)((long)(pSVar3->coWeights).val.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pdVar4) >> 3);
  if (start < iVar9) {
    pdVar5 = (pSVar3->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = (ulong)start;
    dVar10 = 0.0;
    do {
      dVar1 = pdVar5[uVar8];
      if (dVar1 < -feastol) {
        dVar2 = pdVar4[uVar8];
        dVar11 = feastol;
        if (feastol <= dVar2) {
          dVar11 = dVar2;
        }
        dVar11 = (dVar1 * dVar1) / dVar11;
        if (dVar10 < dVar11) {
          this->last = dVar2;
          uVar7 = uVar8 & 0xffffffff;
          dVar10 = dVar11;
        }
      }
      iVar6 = (int)uVar7;
      uVar8 = uVar8 + (long)incr;
    } while ((long)uVar8 < (long)iVar9);
  }
  return iVar6;
}

Assistant:

int SPxDevexPR<R>::selectLeaveX(R feastol, int start, int incr)
{
   R x;

   const R* fTest = this->thesolver->fTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   R best = 0;
   int bstI = -1;
   int end = this->thesolver->coWeights.dim();

   for(; start < end; start += incr)
   {
      if(fTest[start] < -feastol)
      {
         x = devexpr::computePrice(fTest[start], cpen[start], feastol);

         if(x > best)
         {
            best = x;
            bstI = start;
            last = cpen[start];
         }
      }
   }

   return bstI;
}